

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O0

size_t __thiscall groundupdbext::HighwayHash::operator()(HighwayHash *this,Bytes *data)

{
  HighwayHashCatT<1U> *this_00;
  bool bVar1;
  reference bytes;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_28
  ;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_20
  ;
  const_iterator iter;
  Bytes *data_local;
  HighwayHash *this_local;
  
  iter._M_current = (byte *)data;
  highwayhash::HighwayHashCatT<1U>::Reset(this->m_hh,this->m_key);
  local_20._M_current =
       (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::begin(iter._M_current);
  while( true ) {
    local_28._M_current =
         (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::end(iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_00 = this->m_hh;
    bytes = __gnu_cxx::
            __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
            ::operator*(&local_20);
    highwayhash::HighwayHashCatT<1U>::Append(this_00,(char *)bytes,1);
    __gnu_cxx::
    __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
    operator++(&local_20);
  }
  highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(this->m_hh,this->m_result);
  return *this->m_result;
}

Assistant:

std::size_t
HighwayHash::operator() (const groundupdb::Bytes& data) const noexcept {
  m_hh->Reset(m_key);
  for (auto iter = data.begin();iter != data.end();++iter) {
    m_hh->Append((const char*)&*iter,sizeof(*iter));
  }
  m_hh->Finalize(m_result);
  return *m_result;
}